

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

int __thiscall tcu::CaseTreeNode::findChildNdx(CaseTreeNode *this,string *name)

{
  pointer ppCVar1;
  pointer __s2;
  size_t sVar2;
  CaseTreeNode *pCVar3;
  size_t __n;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  ppCVar1 = (this->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(this->m_children).
                               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3);
  if (0 < (int)uVar6) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    uVar5 = 0;
    do {
      pCVar3 = ppCVar1[uVar5];
      __n = (pCVar3->m_name)._M_string_length;
      if ((__n == sVar2) &&
         ((__n == 0 || (iVar4 = bcmp((pCVar3->m_name)._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) {
        return (int)uVar5;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  return -1;
}

Assistant:

int CaseTreeNode::findChildNdx (const std::string& name) const
{
	for (int ndx = 0; ndx < (int)m_children.size(); ++ndx)
	{
		if (m_children[ndx]->getName() == name)
			return ndx;
	}
	return NOT_FOUND;
}